

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_address.cpp
# Opt level: O0

void __thiscall
cfd::core::Address::Address(Address *this,NetType_conflict type,Pubkey *pubkey,uint8_t prefix)

{
  Pubkey *in_stack_ffffffffffffff58;
  Pubkey *in_stack_ffffffffffffff60;
  NetType_conflict local_64;
  AddressType local_54;
  CfdSourceLocation local_50;
  allocator local_22;
  uint8_t local_21;
  Pubkey *pPStack_20;
  uint8_t prefix_local;
  Pubkey *pubkey_local;
  Address *pAStack_10;
  NetType_conflict type_local;
  Address *this_local;
  
  local_64 = type;
  if (prefix != '\0') {
    local_64 = kCfdConnectionError;
  }
  this->type_ = local_64;
  this->addr_type_ = kP2pkhAddress;
  this->witness_ver_ = kVersionNone;
  local_21 = prefix;
  pPStack_20 = pubkey;
  pubkey_local._4_4_ = type;
  pAStack_10 = this;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&this->address_,"",&local_22);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_22);
  ByteData::ByteData(&this->hash_);
  Pubkey::Pubkey(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  SchnorrPubkey::SchnorrPubkey(&this->schnorr_pubkey_);
  TaprootScriptTree::TaprootScriptTree(&this->script_tree_);
  Script::Script(&this->redeem_script_);
  AddressFormatData::AddressFormatData(&this->format_data_);
  this->checksum_[0] = '\0';
  this->checksum_[1] = '\0';
  this->checksum_[2] = '\0';
  this->checksum_[3] = '\0';
  CalculateP2PKH(this,local_21);
  local_50.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_address.cpp"
               ,0x2f);
  local_50.filename = local_50.filename + 1;
  local_50.line = 0x12e;
  local_50.funcname = "Address";
  local_54 = kP2pkhAddress;
  logger::info<cfd::core::NetType&,cfd::core::AddressType,unsigned_char&>
            (&local_50,"call Address({},{},{})",&this->type_,&local_54,&local_21);
  return;
}

Assistant:

Address::Address(NetType type, const Pubkey& pubkey, uint8_t prefix)
    : type_((prefix != 0) ? kCustomChain : type),
      addr_type_(AddressType::kP2pkhAddress),
      witness_ver_(kVersionNone),
      address_(""),
      hash_(),
      pubkey_(pubkey),
      schnorr_pubkey_(),
      redeem_script_() {
  memset(checksum_, 0, sizeof(checksum_));
  CalculateP2PKH(prefix);
  info(
      CFD_LOG_SOURCE, "call Address({},{},{})", type_,
      AddressType::kP2pkhAddress, prefix);
}